

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ht_spkitable_locks.c
# Opt level: O2

void lock_test1(void)

{
  tr_socket *__ptr;
  int iVar1;
  spki_record *ski;
  rtr_socket *in_RCX;
  long lVar2;
  uint i;
  rtr_socket *__arg;
  undefined8 *__arg_00;
  int ASN;
  spki_record **ppsVar3;
  long in_FS_OFFSET;
  undefined8 local_4e8;
  undefined4 local_4e0 [76];
  undefined8 uStack_3b0;
  undefined1 auStack_3a8 [8];
  undefined1 *local_3a0;
  uint local_394;
  undefined1 auStack_390 [4];
  uint result_size;
  spki_record *result;
  rtr_socket local_2e8 [2];
  undefined1 local_1a8 [8];
  spki_table spkit;
  
  local_3a0 = auStack_3a8;
  spkit.lock._48_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  uStack_3b0 = 0x1022a3;
  spki_table_init((spki_table *)local_1a8,(spki_update_fp)0x0);
  __arg = local_2e8;
  ppsVar3 = &result;
  for (lVar2 = 0; lVar2 != 200000; lVar2 = lVar2 + 10000) {
    __arg->tr_socket = (tr_socket *)local_1a8;
    __arg->refresh_interval = (uint)lVar2;
    *(undefined4 *)&__arg->field_0xc = 10000;
    uStack_3b0 = 0x1022e0;
    in_RCX = __arg;
    pthread_create((pthread_t *)ppsVar3,(pthread_attr_t *)0x0,add_records,__arg);
    __arg = (rtr_socket *)&__arg->last_update;
    ppsVar3 = ppsVar3 + 1;
  }
  for (lVar2 = 0; lVar2 != 0x14; lVar2 = lVar2 + 1) {
    uStack_3b0 = 0x102310;
    pthread_join((pthread_t)(&result)[lVar2],(void **)0x0);
    uStack_3b0 = 0x10231d;
    printf("Thread %i returned\n");
  }
  local_394 = 0;
  ASN = 0;
  uStack_3b0 = 0x5b;
  while( true ) {
    if (ASN == 200000) {
      __arg_00 = &local_4e8;
      ppsVar3 = &result;
      for (lVar2 = 0; lVar2 != 200000; lVar2 = lVar2 + 10000) {
        *__arg_00 = (spki_table *)local_1a8;
        *(int *)(__arg_00 + 1) = (int)lVar2;
        *(undefined4 *)((long)__arg_00 + 0xc) = 10000;
        pthread_create((pthread_t *)ppsVar3,(pthread_attr_t *)0x0,remove_records,__arg_00);
        __arg_00 = __arg_00 + 2;
        ppsVar3 = ppsVar3 + 1;
      }
      for (lVar2 = 0; lVar2 != 0x14; lVar2 = lVar2 + 1) {
        pthread_join((pthread_t)(&result)[lVar2],(void **)0x0);
        printf("Thread %i returned\n");
      }
      spki_table_free((spki_table *)local_1a8);
      printf("%s() complete\n","lock_test1");
      if (*(long *)(in_FS_OFFSET + 0x28) == spkit.lock._48_8_) {
        return;
      }
      *(code **)(local_3a0 + -8) = add_records;
      __stack_chk_fail();
    }
    uStack_3b0 = 0x102355;
    ski = create_record(ASN,ASN,ASN,in_RCX);
    in_RCX = (rtr_socket *)auStack_390;
    uStack_3b0 = 0x102374;
    spki_table_get_all((spki_table *)local_1a8,ski->asn,ski->ski,(spki_record **)in_RCX,&local_394);
    __ptr = _auStack_390;
    if (local_394 != 1) {
      uStack_3b0 = 0x1024fb;
      __assert_fail("result_size == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable_locks.c"
                    ,0x90,"void lock_test1(void)");
    }
    if ((ski->asn != *(uint32_t *)(_auStack_390 + 0x14)) ||
       (ski->socket != *(rtr_socket **)(_auStack_390 + 0x78))) break;
    uStack_3b0 = 0x1023b4;
    iVar1 = bcmp(ski,_auStack_390,0x14);
    if (iVar1 != 0) break;
    uStack_3b0 = 0x1023cf;
    iVar1 = bcmp(ski->spki,__ptr + 0x18,0x5b);
    if (iVar1 != 0) break;
    uStack_3b0 = 0x1023df;
    free(__ptr);
    uStack_3b0 = 0x1023e7;
    free(ski);
    ASN = ASN + 1;
  }
  uStack_3b0 = 0x1024dc;
  __assert_fail("compare_spki_records(record, &result[0])",
                "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable_locks.c"
                ,0x91,"void lock_test1(void)");
}

Assistant:

static void lock_test1(void)
{
	unsigned int max_threads = 20;
	unsigned int records_per_thread = 10000;
	struct spki_table spkit;
	struct add_records_args args[max_threads];

	spki_table_init(&spkit, NULL);
	pthread_t threads[max_threads];

	/* Concurrently add SPKI records to the table */
	for (unsigned int i = 0; i < max_threads; i++) {
		args[i].table = &spkit;
		args[i].start_asn = i * records_per_thread;
		args[i].count = records_per_thread;
		pthread_create(&threads[i], NULL, (void *(*)(void *))add_records, &args[i]);
	}

	/* Wait for parallel add operations to finish */
	for (unsigned int i = 0; i < max_threads; i++) {
		pthread_join(threads[i], NULL);
		printf("Thread %i returned\n", i);
	}

	/* Check all records for successful add */
	struct spki_record *result;
	unsigned int result_size = 0;

	for (unsigned int i = 0; i < records_per_thread * max_threads; i++) {
		struct spki_record *record = create_record(i, i, i, NULL);

		spki_table_get_all(&spkit, record->asn, record->ski, &result, &result_size);
		assert(result_size == 1);
		assert(compare_spki_records(record, &result[0]));
		free(result);
		free(record);
	}

	struct remove_records_args remove_args[max_threads];
	/* Concurrently delete SPKI records */
	for (unsigned int i = 0; i < max_threads; i++) {
		remove_args[i].table = &spkit;
		remove_args[i].start_asn = i * records_per_thread;
		remove_args[i].count = records_per_thread;
		pthread_create(&threads[i], NULL, (void *(*)(void *))remove_records, &remove_args[i]);
	}

	/* Wait for parallel delete operation to finish */
	for (unsigned int i = 0; i < max_threads; i++) {
		pthread_join(threads[i], NULL);
		printf("Thread %i returned\n", i);
	}

	/* cleanup: free spki_table */
	spki_table_free(&spkit);
	printf("%s() complete\n", __func__);
}